

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_table.cpp
# Opt level: O0

void __thiscall
ArrayTable_QuotedKey_Test::~ArrayTable_QuotedKey_Test(ArrayTable_QuotedKey_Test *this)

{
  ArrayTable_QuotedKey_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(ArrayTable, QuotedKey) {
    std::istringstream input("[[\"table\\ntable\"]]");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::table_array_item, {"table\ntable"}},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}